

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_conversion_to_int_array_with_runoptimize(void)

{
  ulong uVar1;
  _Bool _Var2;
  uint32_t i;
  uint32_t uVar3;
  uint uVar4;
  roaring_bitmap_t *prVar5;
  uint32_t *a;
  uint64_t uVar6;
  uint32_t *puVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  unsigned_long result;
  uint uVar11;
  
  iVar10 = 0;
  prVar5 = roaring_bitmap_create_with_capacity(0);
  a = (uint32_t *)calloc(100000,4);
  uVar3 = 0;
  do {
    if (uVar3 != 30000) {
      lVar8 = (long)iVar10;
      iVar10 = iVar10 + 1;
      a[lVar8] = uVar3;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 50000);
  puVar7 = a + iVar10;
  uVar11 = iVar10 + 0xdca;
  uVar3 = 70000;
  do {
    *puVar7 = uVar3;
    uVar3 = uVar3 + 0x11;
    puVar7 = puVar7 + 1;
  } while (uVar3 != 0x1fbda);
  uVar4 = 0x30000;
  do {
    if ((uVar4 / 3) * 3 != uVar4) {
      lVar8 = (long)(int)uVar11;
      uVar11 = uVar11 + 1;
      a[lVar8] = uVar4;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x40000);
  roaring_bitmap_free(prVar5);
  prVar5 = make_roaring_from_array(a,uVar11);
  _Var2 = roaring_bitmap_run_optimize(prVar5);
  _assert_true((ulong)_Var2,"roaring_bitmap_run_optimize(r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xa8e);
  uVar6 = roaring_bitmap_get_cardinality(prVar5);
  puVar7 = (uint32_t *)malloc(uVar6 * 4);
  roaring_bitmap_to_uint32_array(prVar5,puVar7);
  uVar4 = (uint)uVar6;
  if (uVar11 == uVar4) {
    uVar11 = (uint)((int)uVar4 < 1);
    if (0 < (int)uVar4) {
      if (*puVar7 == *a) {
        uVar1 = 1;
        do {
          uVar9 = uVar1;
          if ((uVar4 & 0x7fffffff) == uVar9) break;
          uVar1 = uVar9 + 1;
        } while (puVar7[uVar9] == a[uVar9]);
        uVar11 = (uint)((uVar4 & 0x7fffffff) <= uVar9);
      }
      else {
        uVar11 = 0;
      }
    }
    result = (unsigned_long)uVar11;
  }
  else {
    result = 0;
  }
  _assert_true(result,"array_equals(arr, (int)card, ans, ans_ctr)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xa94);
  roaring_bitmap_free(prVar5);
  free(puVar7);
  free(a);
  return;
}

Assistant:

DEFINE_TEST(test_conversion_to_int_array_with_runoptimize) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    int ans_ctr = 0;
    uint32_t *ans = (uint32_t *)calloc(100000, sizeof(int32_t));

    // a dense bitmap container  (best done with runs)
    for (uint32_t i = 0; i < 50000; ++i) {
        if (i != 30000) {  // making 2 runs
            ans[ans_ctr++] = i;
        }
    }

    // a sparse one
    for (uint32_t i = 70000; i < 130000; i += 17) {
        ans[ans_ctr++] = i;
    }

    // a dense one but not good for runs

    for (uint32_t i = 65536 * 3; i < 65536 * 4; i++) {
        if (i % 3 != 0) {
            ans[ans_ctr++] = i;
        }
    }
    roaring_bitmap_free(r1);

    r1 = make_roaring_from_array(ans, ans_ctr);
    assert_true(roaring_bitmap_run_optimize(r1));

    uint64_t card = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr = (uint32_t *)malloc(card * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(r1, arr);

    assert_true(array_equals(arr, (int)card, ans, ans_ctr));
    roaring_bitmap_free(r1);
    free(arr);
    free(ans);
}